

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltcdf.cc
# Opt level: O0

void anon_unknown.dwarf_1732::PrintUsage(ostream *stream)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  char *pcVar4;
  ostream *in_RDI;
  
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," ltcdf - all-pole lattice digital filter for speech synthesis");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  usage:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       ltcdf [ options ] kfile [ infile ] > stdout");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  options:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -m m  : order of filter coefficients (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0x19);
  poVar2 = std::operator<<(poVar2,"][ 0 <= m <=     ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -p p  : frame period                 (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,100);
  poVar2 = std::operator<<(poVar2,"][ 0 <  p <=     ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -i i  : interpolation period         (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,1);
  poVar2 = std::operator<<(poVar2,"][ 0 <= i <= p/2 ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -k    : filtering without gain       (  bool)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  pcVar4 = sptk::ConvertBooleanToString(false);
  poVar2 = std::operator<<(poVar2,pcVar4);
  poVar2 = std::operator<<(poVar2,"]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -h    : print this message");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  kfile:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       filter (PARCOR) coefficients         (double)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  infile:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       filter input                         (double)[stdin]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  stdout:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       filter output                        (double)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  notice:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       if i = 0, don\'t interpolate filter coefficients");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " ltcdf - all-pole lattice digital filter for speech synthesis" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       ltcdf [ options ] kfile [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -m m  : order of filter coefficients (   int)[" << std::setw(5) << std::right << kDefaultNumFilterOrder      << "][ 0 <= m <=     ]" << std::endl;  // NOLINT
  *stream << "       -p p  : frame period                 (   int)[" << std::setw(5) << std::right << kDefaultFramePeriod         << "][ 0 <  p <=     ]" << std::endl;  // NOLINT
  *stream << "       -i i  : interpolation period         (   int)[" << std::setw(5) << std::right << kDefaultInterpolationPeriod << "][ 0 <= i <= p/2 ]" << std::endl;  // NOLINT
  *stream << "       -k    : filtering without gain       (  bool)[" << std::setw(5) << std::right << sptk::ConvertBooleanToString(!kDefaultGainFlag) << "]" << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  kfile:" << std::endl;
  *stream << "       filter (PARCOR) coefficients         (double)" << std::endl;  // NOLINT
  *stream << "  infile:" << std::endl;
  *stream << "       filter input                         (double)[stdin]" << std::endl;  // NOLINT
  *stream << "  stdout:" << std::endl;
  *stream << "       filter output                        (double)" << std::endl;  // NOLINT
  *stream << "  notice:" << std::endl;
  *stream << "       if i = 0, don't interpolate filter coefficients" << std::endl;  // NOLINT
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}